

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

bool __thiscall
cmLocalUnixMakefileGenerator3::ScanDependencies
          (cmLocalUnixMakefileGenerator3 *this,string *targetDir,string *dependFile,
          string *internalDependFile,DependencyMap *validDeps)

{
  cmMakefile *this_00;
  bool bVar1;
  Encoding EVar2;
  int iVar3;
  string *psVar4;
  cmValue cVar5;
  cmValue topBinary;
  cmDependsC *this_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view arg;
  string_view value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  langs;
  cmGeneratedFileStream ruleFileStream;
  cmGeneratedFileStream internalRuleFileStream;
  undefined1 local_550 [32];
  string *local_530;
  DependencyMap *local_528;
  cmLocalUnixMakefileGenerator3 *local_520;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_518;
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  byte abStack_4e0 [584];
  undefined1 local_298 [32];
  byte abStack_278 [584];
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_530 = internalDependFile;
  local_528 = validDeps;
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  local_500._8_8_ = (psVar4->_M_dataplus)._M_p;
  local_500._0_8_ = psVar4->_M_string_length;
  local_4f0._0_8_ = 0x2b;
  local_4f0._8_8_ = "/CMakeFiles/CMakeDirectoryInformation.cmake";
  views._M_len = 2;
  views._M_array = (iterator)local_500;
  cmCatViews_abi_cxx11_((string *)local_298,views);
  bVar1 = cmMakefile::ReadListFile(this_00,(string *)local_298);
  if (bVar1) {
    bVar1 = true;
    if ((cmSystemTools::s_ErrorOccurred == false) && (cmSystemTools::s_FatalErrorOccurred == false))
    {
      bVar1 = cmSystemTools::GetInterruptFlag();
    }
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    if (bVar1 == false) {
      local_500._0_8_ = local_4f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_500,"CMAKE_FORCE_UNIX_PATHS","");
      cVar5 = cmMakefile::GetDefinition(this_00,(string *)local_500);
      if ((undefined1 *)local_500._0_8_ != local_4f0) {
        operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
      }
      if ((cVar5.Value != (string *)0x0) &&
         (value._M_str = ((cVar5.Value)->_M_dataplus)._M_p,
         value._M_len = (cVar5.Value)->_M_string_length, bVar1 = cmValue::IsOff(value), !bVar1)) {
        cmSystemTools::s_ForceUnixPaths = true;
      }
      local_500._0_8_ = local_4f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_500,"CMAKE_RELATIVE_PATH_TOP_SOURCE","");
      cVar5 = cmMakefile::GetDefinition(this_00,(string *)local_500);
      if ((undefined1 *)local_500._0_8_ != local_4f0) {
        operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
      }
      local_500._0_8_ = local_4f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_500,"CMAKE_RELATIVE_PATH_TOP_BINARY","");
      topBinary = cmMakefile::GetDefinition(this_00,(string *)local_500);
      if ((undefined1 *)local_500._0_8_ != local_4f0) {
        operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
      }
      if (topBinary.Value != (string *)0x0 && cVar5.Value != (string *)0x0) {
        cmOutputConverter::SetRelativePathTop
                  (&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,cVar5.Value,topBinary.Value);
      }
      goto LAB_0050341a;
    }
  }
  else if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  local_500._0_8_ = local_4f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_500,"Directory Information file not found","");
  cmSystemTools::Error((string *)local_500);
  if ((undefined1 *)local_500._0_8_ != local_4f0) {
    operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
  }
LAB_0050341a:
  EVar2 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_500,dependFile,false,EVar2);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_500,true);
  if ((abStack_4e0[*(long *)(local_500._0_8_ + -0x18)] & 5) == 0) {
    EVar2 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_298,local_530,false,EVar2);
    bVar1 = (abStack_278[*(long *)(local_298._0_8_ + -0x18)] & 5) == 0;
    if (bVar1) {
      WriteDisclaimer(this,(ostream *)local_500);
      WriteDisclaimer(this,(ostream *)local_298);
      local_550._0_8_ = (cmDependsC *)(local_550 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_550,"CMAKE_DEPENDS_LANGUAGES","");
      psVar4 = cmMakefile::GetSafeDefinition(this_00,(string *)local_550);
      arg._M_str = (psVar4->_M_dataplus)._M_p;
      arg._M_len = psVar4->_M_string_length;
      cmExpandedList_abi_cxx11_(&local_518,arg,false);
      psVar4 = local_518.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((cmDependsC *)local_550._0_8_ != (cmDependsC *)(local_550 + 0x10)) {
        operator_delete((void *)local_550._0_8_,local_550._16_8_ + 1);
        psVar4 = local_518.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      for (; psVar4 != local_518.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; psVar4 = psVar4 + 1) {
        iVar3 = std::__cxx11::string::compare((char *)psVar4);
        if ((((((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)psVar4), iVar3 == 0))
              || (iVar3 = std::__cxx11::string::compare((char *)psVar4), iVar3 == 0)) ||
             ((iVar3 = std::__cxx11::string::compare((char *)psVar4), iVar3 == 0 ||
              (iVar3 = std::__cxx11::string::compare((char *)psVar4), iVar3 == 0)))) ||
            ((iVar3 = std::__cxx11::string::compare((char *)psVar4), iVar3 == 0 ||
             ((iVar3 = std::__cxx11::string::compare((char *)psVar4), iVar3 == 0 ||
              (iVar3 = std::__cxx11::string::compare((char *)psVar4), iVar3 == 0)))))) ||
           (iVar3 = std::__cxx11::string::compare((char *)psVar4), iVar3 == 0)) {
          this_01 = (cmDependsC *)operator_new(0x570);
          cmDependsC::cmDependsC(this_01,this,targetDir,psVar4,local_528);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar3 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_500,"# Note that incremental build could trigger ",0x2c);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_500,"a call to cmake_copy_f90_mod on each re-build\n",0x2e);
            local_520 = this;
            std::make_unique<cmDependsFortran,cmLocalUnixMakefileGenerator3*>
                      ((cmLocalUnixMakefileGenerator3 **)local_550);
            this_01 = (cmDependsC *)local_550._0_8_;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)psVar4);
            if (iVar3 == 0) {
              std::make_unique<cmDependsJava>();
              this_01 = (cmDependsC *)local_550._0_8_;
            }
            else {
              this_01 = (cmDependsC *)0x0;
            }
          }
        }
        if (this_01 != (cmDependsC *)0x0) {
          (this_01->super_cmDepends).LocalGenerator = this;
          (this_01->super_cmDepends).FileTimeCache =
               (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                CMakeInstance->FileTimeCache)._M_t.
               super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>._M_t.
               super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>.
               super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl;
          std::__cxx11::string::_M_assign((string *)&(this_01->super_cmDepends).Language);
          std::__cxx11::string::_M_assign((string *)&(this_01->super_cmDepends).TargetDirectory);
          cmDepends::Write(&this_01->super_cmDepends,(ostream *)local_500,(ostream *)local_298);
          (*(this_01->super_cmDepends)._vptr_cmDepends[1])(this_01);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_518);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  }
  else {
    bVar1 = false;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_500);
  return bVar1;
}

Assistant:

bool cmLocalUnixMakefileGenerator3::ScanDependencies(
  std::string const& targetDir, std::string const& dependFile,
  std::string const& internalDependFile, cmDepends::DependencyMap& validDeps)
{
  // Read the directory information file.
  cmMakefile* mf = this->Makefile;
  bool haveDirectoryInfo = false;
  {
    std::string dirInfoFile =
      cmStrCat(this->GetCurrentBinaryDirectory(),
               "/CMakeFiles/CMakeDirectoryInformation.cmake");
    if (mf->ReadListFile(dirInfoFile) &&
        !cmSystemTools::GetErrorOccurredFlag()) {
      haveDirectoryInfo = true;
    }
  }

  // Lookup useful directory information.
  if (haveDirectoryInfo) {
    // Test whether we need to force Unix paths.
    if (cmValue force = mf->GetDefinition("CMAKE_FORCE_UNIX_PATHS")) {
      if (!cmIsOff(force)) {
        cmSystemTools::SetForceUnixPaths(true);
      }
    }

    // Setup relative path top directories.
    cmValue relativePathTopSource =
      mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_SOURCE");
    cmValue relativePathTopBinary =
      mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_BINARY");
    if (relativePathTopSource && relativePathTopBinary) {
      this->SetRelativePathTop(*relativePathTopSource, *relativePathTopBinary);
    }
  } else {
    cmSystemTools::Error("Directory Information file not found");
  }

  // Open the make depends file.  This should be copy-if-different
  // because the make tool may try to reload it needlessly otherwise.
  cmGeneratedFileStream ruleFileStream(
    dependFile, false, this->GlobalGenerator->GetMakefileEncoding());
  ruleFileStream.SetCopyIfDifferent(true);
  if (!ruleFileStream) {
    return false;
  }

  // Open the cmake dependency tracking file.  This should not be
  // copy-if-different because dependencies are re-scanned when it is
  // older than the DependInfo.cmake.
  cmGeneratedFileStream internalRuleFileStream(
    internalDependFile, false, this->GlobalGenerator->GetMakefileEncoding());
  if (!internalRuleFileStream) {
    return false;
  }

  this->WriteDisclaimer(ruleFileStream);
  this->WriteDisclaimer(internalRuleFileStream);

  // for each language we need to scan, scan it
  std::vector<std::string> langs =
    cmExpandedList(mf->GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES"));
  for (std::string const& lang : langs) {
    // construct the checker
    // Create the scanner for this language
    std::unique_ptr<cmDepends> scanner;
    if (lang == "C" || lang == "CXX" || lang == "RC" || lang == "ASM" ||
        lang == "OBJC" || lang == "OBJCXX" || lang == "CUDA" ||
        lang == "HIP" || lang == "ISPC") {
      // TODO: Handle RC (resource files) dependencies correctly.
      scanner = cm::make_unique<cmDependsC>(this, targetDir, lang, &validDeps);
    }
#ifndef CMAKE_BOOTSTRAP
    else if (lang == "Fortran") {
      ruleFileStream << "# Note that incremental build could trigger "
                     << "a call to cmake_copy_f90_mod on each re-build\n";
      scanner = cm::make_unique<cmDependsFortran>(this);
    } else if (lang == "Java") {
      scanner = cm::make_unique<cmDependsJava>();
    }
#endif

    if (scanner) {
      scanner->SetLocalGenerator(this);
      scanner->SetFileTimeCache(
        this->GlobalGenerator->GetCMakeInstance()->GetFileTimeCache());
      scanner->SetLanguage(lang);
      scanner->SetTargetDirectory(targetDir);
      scanner->Write(ruleFileStream, internalRuleFileStream);
    }
  }

  return true;
}